

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  uchar *p_1;
  uint uVar9;
  undefined1 auVar10 [16];
  secp256k1_scalar seckey_scalar;
  secp256k1_ge_storage s;
  secp256k1_ge p;
  secp256k1_scalar sStack_d8;
  secp256k1_ge_storage local_b8;
  secp256k1_ge local_78;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ec_pubkey_create_cold_3();
  }
  else {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
      secp256k1_ec_pubkey_create_cold_2();
    }
    else {
      if (seckey != (uchar *)0x0) {
        iVar7 = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx,&sStack_d8,&local_78,seckey);
        secp256k1_ge_to_storage(&local_b8,&local_78);
        *(uint64_t *)(pubkey->data + 0x30) = local_b8.y.n[2];
        *(uint64_t *)(pubkey->data + 0x38) = local_b8.y.n[3];
        *(uint64_t *)(pubkey->data + 0x20) = local_b8.y.n[0];
        *(uint64_t *)(pubkey->data + 0x28) = local_b8.y.n[1];
        *(uint64_t *)(pubkey->data + 0x10) = local_b8.x.n[2];
        *(uint64_t *)(pubkey->data + 0x18) = local_b8.x.n[3];
        *(ulong *)pubkey->data = CONCAT44(local_b8.x.n[0]._4_4_,(undefined4)local_b8.x.n[0]);
        *(uint64_t *)(pubkey->data + 8) = local_b8.x.n[1];
        cVar6 = ((byte)iVar7 ^ 1) - 1;
        auVar10 = ZEXT216(CONCAT11(cVar6,cVar6));
        auVar10 = pshuflw(auVar10,auVar10,0);
        uVar9 = auVar10._0_4_;
        lVar8 = 0;
        do {
          puVar1 = pubkey->data + lVar8;
          uVar3 = *(uint *)(puVar1 + 4);
          uVar4 = *(uint *)(puVar1 + 8);
          uVar5 = *(uint *)(puVar1 + 0xc);
          puVar2 = pubkey->data + lVar8;
          *(uint *)puVar2 = *(uint *)puVar1 & uVar9;
          *(uint *)(puVar2 + 4) = uVar3 & uVar9;
          *(uint *)(puVar2 + 8) = uVar4 & uVar9;
          *(uint *)(puVar2 + 0xc) = uVar5 & uVar9;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x40);
        return iVar7;
      }
      secp256k1_ec_pubkey_create_cold_1();
    }
  }
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    secp256k1_memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}